

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall
amrex::FabArrayBase::CPC::define
          (CPC *this,BoxArray *ba_dst,DistributionMapping *dm_dst,
          Vector<int,_std::allocator<int>_> *imap_dst,BoxArray *ba_src,DistributionMapping *dm_src,
          Vector<int,_std::allocator<int>_> *imap_src,int MyProc)

{
  Box *db;
  bool bVar1;
  int iVar2;
  int iVar3;
  Long LVar4;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *isects_00;
  IntVect *v;
  int *piVar5;
  size_type sVar6;
  reference pvVar7;
  BoxList *this_00;
  int iVar8;
  int iVar9;
  undefined1 *in_RDI;
  IntVect *in_R8;
  int in_stack_00000010;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *cctv;
  pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  *kv;
  iterator __end3;
  iterator __begin3;
  MapOfCopyComTagContainers *__range3;
  MapOfCopyComTagContainers *Tags;
  int ipass;
  Box *btile;
  const_iterator __end7_1;
  const_iterator __begin7_1;
  BoxList *__range7_1;
  BoxList tilelist;
  Box *b_1;
  const_iterator __end5;
  const_iterator __begin5;
  BoxList *__range5;
  BoxList bl_dst_1;
  int src_owner;
  Box *bx_1;
  int k_src_1;
  int M_1;
  int j_1;
  const_iterator pit_1;
  Box result_1;
  Box *bx_dst;
  Box *bx_dst_valid;
  int k_dst_1;
  int i_1;
  bool check_remote;
  bool check_local;
  BoxList bl_remote;
  BoxList bl_local;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *recv_tags;
  Box *b;
  const_iterator __end7;
  const_iterator __begin7;
  BoxList *__range7;
  BoxList bl_dst;
  int dst_owner;
  Box *bx;
  int k_dst;
  int M;
  int j;
  const_iterator pit;
  Box result;
  Box *bx_src;
  int k_src;
  int i;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *send_tags;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  IntVect *ng_dst;
  int nlocal_dst;
  IntVect *ng_src;
  int nlocal_src;
  undefined4 in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  BoxArray *in_stack_fffffffffffff970;
  BoxList *in_stack_fffffffffffff978;
  __normal_iterator<amrex::FabArrayBase::CopyComTag_*,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  __last;
  __normal_iterator<amrex::FabArrayBase::CopyComTag_*,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  Box *in_stack_fffffffffffff998;
  undefined7 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a7;
  reference in_stack_fffffffffffff9a8;
  Box *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  IntVect *tilesize;
  Box *pBVar10;
  _Self local_568;
  _Self local_560;
  BoxArray *local_558;
  BoxArray *local_550;
  int local_544;
  BoxArray *in_stack_fffffffffffffb10;
  Box local_470;
  CopyComTag local_454;
  Box local_414;
  CopyComTag local_3f8;
  Box *local_3b8;
  Box *local_3b0;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_3a8;
  undefined1 *local_3a0;
  undefined1 local_398 [32];
  reference local_378;
  Box *local_370;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_368;
  undefined1 *local_360;
  undefined1 local_358 [32];
  int local_338;
  undefined1 local_334 [28];
  undefined1 *local_318;
  int local_310;
  int local_30c;
  int local_308;
  Box local_304;
  IntVect *local_2e8;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_2e0;
  Box local_2d4;
  Box *local_2b8;
  undefined1 local_2ac [28];
  undefined1 *local_290;
  int local_288;
  int local_284;
  byte local_27e;
  byte local_27d;
  uint local_27c;
  uint local_254;
  BoxList *local_230;
  Box local_224;
  CopyComTag local_208;
  Box *local_1c8;
  Box *local_1c0;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_1b8;
  undefined1 *local_1b0;
  undefined1 local_188 [36];
  int local_164;
  Box *local_160;
  int local_158;
  int local_154;
  int local_150;
  IntVect *local_130;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_128 [4];
  Box local_104;
  Box *local_e8;
  int local_e0;
  int local_dc;
  type local_d8;
  undefined1 local_c0 [24];
  undefined1 *local_a8;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_a0;
  undefined4 in_stack_ffffffffffffff90;
  BoxArray *in_stack_ffffffffffffff98;
  
  std::
  make_unique<std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>
            ();
  std::
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  ::operator=((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
               *)in_stack_fffffffffffff970,
              (unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  std::
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                 *)in_stack_fffffffffffff970);
  std::
  make_unique<std::map<int,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>>>>
            ();
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::operator=((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               *)in_stack_fffffffffffff970,
              (unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                 *)in_stack_fffffffffffff970);
  std::
  make_unique<std::map<int,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>>>>
            ();
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::operator=((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               *)in_stack_fffffffffffff970,
              (unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                 *)in_stack_fffffffffffff970);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980._M_current);
  if ((!bVar1) ||
     (bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980._M_current),
     !bVar1)) {
    LVar4 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x10013b4);
    iVar8 = (int)LVar4;
    isects_00 = (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
                (in_RDI + 0x40);
    LVar4 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x10013df);
    iVar9 = (int)LVar4;
    v = (IntVect *)(in_RDI + 0x4c);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x100140a);
    Periodicity::shiftIntVect
              ((Periodicity *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_a8 = local_c0;
    local_d8 = std::
               unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff970);
    for (local_dc = 0; local_dc < iVar8; local_dc = local_dc + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                          CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      local_e0 = *piVar5;
      BoxArray::operator[]
                ((BoxArray *)in_stack_fffffffffffff980._M_current,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
      Box::grow(&local_104,(IntVect *)isects_00);
      local_e8 = &local_104;
      local_128[0]._M_current =
           (IntVect *)
           std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                     ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                      CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      while( true ) {
        local_130 = (IntVect *)
                    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                            *)in_stack_fffffffffffff970,
                           (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                            *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
        ::operator*(local_128);
        Box::operator+((Box *)in_stack_fffffffffffff970,
                       (IntVect *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        BoxArray::intersections
                  (in_stack_ffffffffffffff98,(Box *)CONCAT44(iVar8,in_stack_ffffffffffffff90),
                   isects_00,SUB41((uint)iVar9 >> 0x18,0),v);
        local_150 = 0;
        sVar6 = std::
                vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                size(&local_a0);
        local_154 = (int)sVar6;
        for (; local_150 < local_154; local_150 = local_150 + 1) {
          pvVar7 = std::
                   vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ::operator[](&local_a0,(long)local_150);
          local_158 = pvVar7->first;
          pvVar7 = std::
                   vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ::operator[](&local_a0,(long)local_150);
          local_160 = &pvVar7->second;
          local_164 = DistributionMapping::operator[]
                                ((DistributionMapping *)in_stack_fffffffffffff970,
                                 in_stack_fffffffffffff96c);
          bVar1 = ParallelDescriptor::sameTeam(0);
          iVar3 = in_stack_00000010;
          if ((!bVar1) &&
             (iVar2 = DistributionMapping::operator[]
                                ((DistributionMapping *)in_stack_fffffffffffff970,
                                 in_stack_fffffffffffff96c), iVar3 == iVar2)) {
            if ((in_RDI[100] & 1) == 0) {
              BoxList::BoxList((BoxList *)
                               CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                               in_stack_fffffffffffff998);
            }
            else {
              BoxArray::operator[]
                        ((BoxArray *)in_stack_fffffffffffff980._M_current,
                         (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
              boxDiff(in_stack_fffffffffffff998,
                      (Box *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
            }
            local_1b0 = local_188;
            local_1b8._M_current =
                 (Box *)BoxList::begin((BoxList *)
                                       CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968)
                                      );
            local_1c0 = (Box *)BoxList::end((BoxList *)
                                            CONCAT44(in_stack_fffffffffffff96c,
                                                     in_stack_fffffffffffff968));
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                       *)in_stack_fffffffffffff970,
                                      (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff96c,
                                                  in_stack_fffffffffffff968)), bVar1) {
              local_1c8 = __gnu_cxx::
                          __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                          ::operator*(&local_1b8);
              std::
              map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
              ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                            *)in_stack_fffffffffffff9b0,(key_type *)in_stack_fffffffffffff9a8);
              pBVar10 = local_1c8;
              __gnu_cxx::
              __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
              ::operator*(local_128);
              Box::operator-((Box *)in_stack_fffffffffffff970,
                             (IntVect *)
                             CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
              CopyComTag::CopyComTag(&local_208,pBVar10,&local_224,local_158,local_e0);
              std::
              vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
              ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           *)in_stack_fffffffffffff970,
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
              __gnu_cxx::
              __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
              ::operator++(&local_1b8);
            }
            BoxList::~BoxList((BoxList *)0x10018d1);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
        ::operator++(local_128);
      }
    }
    this_00 = (BoxList *)
              std::
              unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                           *)in_stack_fffffffffffff970);
    local_230 = this_00;
    local_254 = (uint)BoxArray::ixType((BoxArray *)
                                       CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968)
                                      );
    BoxList::BoxList((BoxList *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                     (IndexType)(uint)((ulong)in_stack_fffffffffffff970 >> 0x20));
    local_27c = (uint)BoxArray::ixType((BoxArray *)
                                       CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968)
                                      );
    BoxList::BoxList((BoxList *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                     (IndexType)(uint)((ulong)in_stack_fffffffffffff970 >> 0x20));
    local_27d = 0;
    local_27e = 0;
    iVar3 = ParallelDescriptor::TeamSize();
    if (1 < iVar3) {
      local_27d = 1;
    }
    for (local_284 = 0; local_284 < iVar9; local_284 = local_284 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                          CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      local_288 = *piVar5;
      BoxArray::operator[]
                ((BoxArray *)in_stack_fffffffffffff980._M_current,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
      local_290 = local_2ac;
      Box::grow(&local_2d4,v);
      local_2b8 = &local_2d4;
      local_2e0._M_current =
           (IntVect *)
           std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                     ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                      CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      while( true ) {
        local_2e8 = (IntVect *)
                    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                            *)in_stack_fffffffffffff970,
                           (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                            *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        if (!bVar1) break;
        tilesize = in_R8;
        __gnu_cxx::
        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
        ::operator*(&local_2e0);
        pBVar10 = &local_304;
        Box::operator+((Box *)in_stack_fffffffffffff970,
                       (IntVect *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        BoxArray::intersections
                  (in_stack_ffffffffffffff98,(Box *)CONCAT44(iVar8,in_stack_ffffffffffffff90),
                   isects_00,SUB41((uint)iVar9 >> 0x18,0),v);
        local_308 = 0;
        sVar6 = std::
                vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                size(&local_a0);
        local_30c = (int)sVar6;
        for (; local_308 < local_30c; local_308 = local_308 + 1) {
          pvVar7 = std::
                   vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ::operator[](&local_a0,(long)local_308);
          local_310 = pvVar7->first;
          std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          operator[](&local_a0,(long)local_308);
          __gnu_cxx::
          __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
          ::operator*(&local_2e0);
          Box::operator-((Box *)in_stack_fffffffffffff970,
                         (IntVect *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          local_318 = local_334;
          local_338 = DistributionMapping::operator[]
                                ((DistributionMapping *)in_stack_fffffffffffff970,
                                 in_stack_fffffffffffff96c);
          if ((in_RDI[100] & 1) == 0) {
            BoxList::BoxList((BoxList *)
                             CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                             in_stack_fffffffffffff998);
          }
          else {
            boxDiff(in_stack_fffffffffffff998,
                    (Box *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
          }
          local_360 = local_358;
          local_368._M_current =
               (Box *)BoxList::begin((BoxList *)
                                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          local_370 = (Box *)BoxList::end((BoxList *)
                                          CONCAT44(in_stack_fffffffffffff96c,
                                                   in_stack_fffffffffffff968));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                     *)in_stack_fffffffffffff970,
                                    (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968)
                                   ), bVar1) {
            local_378 = __gnu_cxx::
                        __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        ::operator*(&local_368);
            bVar1 = ParallelDescriptor::sameTeam
                              ((int)((ulong)in_stack_fffffffffffff970 >> 0x20),
                               (int)in_stack_fffffffffffff970);
            if (bVar1) {
              BoxList::BoxList(this_00,pBVar10,tilesize);
              local_3a0 = local_398;
              local_3a8._M_current =
                   (Box *)BoxList::begin((BoxList *)
                                         CONCAT44(in_stack_fffffffffffff96c,
                                                  in_stack_fffffffffffff968));
              local_3b0 = (Box *)BoxList::end((BoxList *)
                                              CONCAT44(in_stack_fffffffffffff96c,
                                                       in_stack_fffffffffffff968));
              while (bVar1 = __gnu_cxx::operator!=
                                       ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                         *)in_stack_fffffffffffff970,
                                        (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff96c,
                                                    in_stack_fffffffffffff968)), bVar1) {
                local_3b8 = __gnu_cxx::
                            __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                            ::operator*(&local_3a8);
                std::
                unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                ::operator->((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                              *)0x1001da5);
                db = local_3b8;
                __gnu_cxx::
                __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                ::operator*(&local_2e0);
                Box::operator+((Box *)in_stack_fffffffffffff970,
                               (IntVect *)
                               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                CopyComTag::CopyComTag(&local_3f8,db,&local_414,local_288,local_310);
                std::
                vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             *)in_stack_fffffffffffff970,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                __gnu_cxx::
                __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                ::operator++(&local_3a8);
              }
              if ((local_27d & 1) != 0) {
                BoxList::push_back((BoxList *)in_stack_fffffffffffff970,
                                   (Box *)CONCAT44(in_stack_fffffffffffff96c,
                                                   in_stack_fffffffffffff968));
              }
              BoxList::~BoxList((BoxList *)0x1001ebc);
            }
            else {
              iVar3 = in_stack_00000010;
              iVar2 = DistributionMapping::operator[]
                                ((DistributionMapping *)in_stack_fffffffffffff970,
                                 in_stack_fffffffffffff96c);
              if (iVar3 == iVar2) {
                std::
                map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                              *)in_stack_fffffffffffff9b0,(key_type *)in_stack_fffffffffffff9a8);
                in_stack_fffffffffffff9a8 = local_378;
                __gnu_cxx::
                __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                ::operator*(&local_2e0);
                in_stack_fffffffffffff9b0 = &local_470;
                Box::operator+((Box *)in_stack_fffffffffffff970,
                               (IntVect *)
                               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                CopyComTag::CopyComTag
                          (&local_454,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9b0,local_288,
                           local_310);
                std::
                vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             *)in_stack_fffffffffffff970,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                if ((local_27e & 1) != 0) {
                  BoxList::push_back((BoxList *)in_stack_fffffffffffff970,
                                     (Box *)CONCAT44(in_stack_fffffffffffff96c,
                                                     in_stack_fffffffffffff968));
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
            ::operator++(&local_368);
          }
          BoxList::~BoxList((BoxList *)0x1001fc2);
        }
        __gnu_cxx::
        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
        ::operator++(&local_2e0);
      }
    }
    LVar4 = BoxList::size((BoxList *)0x1002023);
    if (LVar4 < 2) {
      *in_RDI = 1;
    }
    else {
      BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff980._M_current,in_stack_fffffffffffff978)
      ;
      bVar1 = BoxArray::isDisjoint(in_stack_fffffffffffffb10);
      *in_RDI = bVar1;
      BoxArray::~BoxArray(in_stack_fffffffffffff970);
    }
    LVar4 = BoxList::size((BoxList *)0x10020b3);
    if (LVar4 < 2) {
      in_RDI[1] = 1;
    }
    else {
      BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff980._M_current,in_stack_fffffffffffff978)
      ;
      bVar1 = BoxArray::isDisjoint(in_stack_fffffffffffffb10);
      in_RDI[1] = bVar1;
      BoxArray::~BoxArray(in_stack_fffffffffffff970);
    }
    for (local_544 = 0; local_544 < 2; local_544 = local_544 + 1) {
      if (local_544 == 0) {
        in_stack_fffffffffffff980._M_current =
             (CopyComTag *)
             std::
             unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                          *)in_stack_fffffffffffff970);
        __last._M_current = in_stack_fffffffffffff980._M_current;
      }
      else {
        in_stack_fffffffffffff970 =
             (BoxArray *)
             std::
             unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                          *)in_stack_fffffffffffff970);
        __last._M_current = (CopyComTag *)in_stack_fffffffffffff970;
      }
      local_558 = (BoxArray *)__last._M_current;
      local_550 = (BoxArray *)__last._M_current;
      local_560._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
           ::begin((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      local_568._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
           ::end((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      while (bVar1 = std::operator!=(&local_560,&local_568), bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                     *)0x1002212);
        std::
        vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>::
        begin((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
               *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        std::
        vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>::
        end((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
             *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        std::
        sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>>
                  (in_stack_fffffffffffff980,__last);
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                      *)in_stack_fffffffffffff970);
      }
    }
    BoxList::~BoxList((BoxList *)0x10022a8);
    BoxList::~BoxList((BoxList *)0x10022b5);
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
               in_stack_fffffffffffff980._M_current);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffff980._M_current);
  }
  return;
}

Assistant:

void
FabArrayBase::CPC::define (const BoxArray& ba_dst, const DistributionMapping& dm_dst,
                           const Vector<int>& imap_dst,
                           const BoxArray& ba_src, const DistributionMapping& dm_src,
                           const Vector<int>& imap_src,
                           int MyProc)
{
    BL_PROFILE("FabArrayBase::CPC::define()");

    BL_ASSERT(ba_dst.size() > 0 && ba_src.size() > 0);
    BL_ASSERT(ba_dst.ixType() == ba_src.ixType());

    m_LocTags = std::make_unique<CopyComTag::CopyComTagsContainer>();
    m_SndTags = std::make_unique<CopyComTag::MapOfCopyComTagContainers>();
    m_RcvTags = std::make_unique<CopyComTag::MapOfCopyComTagContainers>();

    if (!(imap_dst.empty() && imap_src.empty()))
    {
        const int nlocal_src = imap_src.size();
        const IntVect& ng_src = m_srcng;
        const int nlocal_dst = imap_dst.size();
        const IntVect& ng_dst = m_dstng;

        std::vector< std::pair<int,Box> > isects;

        const std::vector<IntVect>& pshifts = m_period.shiftIntVect();

        auto& send_tags = *m_SndTags;

        for (int i = 0; i < nlocal_src; ++i)
        {
            const int   k_src = imap_src[i];
            const Box& bx_src = amrex::grow(ba_src[k_src], ng_src);

            for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
            {
                ba_dst.intersections(bx_src+(*pit), isects, false, ng_dst);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int k_dst     = isects[j].first;
                    const Box& bx       = isects[j].second;
                    const int dst_owner = dm_dst[k_dst];

                    if (ParallelDescriptor::sameTeam(dst_owner)) {
                        continue; // local copy will be dealt with later
                    } else if (MyProc == dm_src[k_src]) {
                        BoxList const bl_dst = m_tgco ? boxDiff(bx, ba_dst[k_dst]) : BoxList(bx);
                        for (auto const& b : bl_dst) {
                            send_tags[dst_owner].push_back(CopyComTag(b, b-(*pit), k_dst, k_src));
                        }
                    }
                }
            }
        }

        auto& recv_tags = *m_RcvTags;

        BoxList bl_local(ba_dst.ixType());
        BoxList bl_remote(ba_dst.ixType());

        bool check_local = false, check_remote = false;
#if defined(AMREX_USE_GPU)
        check_local = true;
        check_remote = true;
#elif defined(AMREX_USE_OMP)
        if (omp_get_max_threads() > 1) {
            check_local = true;
            check_remote = true;
        }
#endif

        if (ParallelDescriptor::TeamSize() > 1) {
            check_local = true;
        }

        for (int i = 0; i < nlocal_dst; ++i)
        {
            const int   k_dst = imap_dst[i];
            const Box& bx_dst_valid = ba_dst[k_dst];
            const Box& bx_dst = amrex::grow(bx_dst_valid, ng_dst);

            for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
            {
                ba_src.intersections(bx_dst+(*pit), isects, false, ng_src);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int k_src     = isects[j].first;
                    const Box& bx       = isects[j].second - *pit;
                    const int src_owner = dm_src[k_src];

                    BoxList const bl_dst = m_tgco ? boxDiff(bx,bx_dst_valid) : BoxList(bx);
                    for (auto const& b : bl_dst) {
                        if (ParallelDescriptor::sameTeam(src_owner, MyProc)) { // local copy
                            const BoxList tilelist(b, FabArrayBase::comm_tile_size);
                            for (auto const& btile : tilelist) {
                                m_LocTags->push_back(CopyComTag(btile, btile+(*pit), k_dst, k_src));
                            }
                            if (check_local) {
                                bl_local.push_back(b);
                            }
                        } else if (MyProc == dm_dst[k_dst]) {
                            recv_tags[src_owner].push_back(CopyComTag(b, b+(*pit), k_dst, k_src));
                            if (check_remote) {
                                bl_remote.push_back(b);
                            }
                        }
                    }
                }
            }
        }

        if (bl_local.size() <= 1) {
            m_threadsafe_loc = true;
        } else {
            m_threadsafe_loc = BoxArray(std::move(bl_local)).isDisjoint();
        }

        if (bl_remote.size() <= 1) {
            m_threadsafe_rcv = true;
        } else {
            m_threadsafe_rcv = BoxArray(std::move(bl_remote)).isDisjoint();
        }

        for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
        {
            CopyComTag::MapOfCopyComTagContainers & Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
            for (auto& kv : Tags)
            {
                std::vector<CopyComTag>& cctv = kv.second;
                // We need to fix the order so that the send and recv processes match.
                std::sort(cctv.begin(), cctv.end());
            }
        }
    }
}